

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O3

Dsd_Node_t *
dsdKernelFindContainingComponent
          (Dsd_Manager_t *pDsdMan,Dsd_Node_t *pWhere,DdNode *Var,int *fPolarity)

{
  int iVar1;
  long lVar2;
  Dsd_Node_t *pDVar3;
  
  if (pWhere->nDecs == 1) {
    return (Dsd_Node_t *)0x0;
  }
  if (0 < pWhere->nDecs) {
    lVar2 = 0;
    do {
      pDVar3 = (Dsd_Node_t *)((ulong)pWhere->pDecs[lVar2] & 0xfffffffffffffffe);
      iVar1 = Extra_bddSuppContainVar(pDsdMan->dd,pDVar3->S,Var);
      if (iVar1 != 0) {
        *fPolarity = (uint)(pWhere->pDecs[lVar2] != pDVar3);
        return pDVar3;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pWhere->nDecs);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdProc.c"
                ,0x529,
                "Dsd_Node_t *dsdKernelFindContainingComponent(Dsd_Manager_t *, Dsd_Node_t *, DdNode *, int *)"
               );
}

Assistant:

Dsd_Node_t * dsdKernelFindContainingComponent( Dsd_Manager_t * pDsdMan, Dsd_Node_t * pWhere, DdNode * Var, int * fPolarity )

{
    Dsd_Node_t * pTemp;
    int i;

//  assert( !Dsd_IsComplement( pWhere ) );
//  assert( Extra_bddSuppContainVar( pDsdMan->dd, pWhere->S, Var ) );

    if ( pWhere->nDecs == 1 )
        return NULL;

    for( i = 0; i < pWhere->nDecs; i++ )
    {
        pTemp = Dsd_Regular( pWhere->pDecs[i] );
        if ( Extra_bddSuppContainVar( pDsdMan->dd, pTemp->S, Var ) )
        {
            *fPolarity = (int)( pTemp != pWhere->pDecs[i] );
            return pTemp;
        }
    }
    assert( 0 );
    return NULL;
}